

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void cf_interrupt_all(CPUM68KState_conflict *env,int is_hw)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  target_ulong_conflict addr;
  CPUState *cpu;
  uint32_t local_30;
  uint32_t vector;
  uint32_t retaddr;
  uint32_t fmt;
  uint32_t sr;
  uint32_t sp;
  CPUState *cs;
  int is_hw_local;
  CPUM68KState_conflict *env_local;
  
  cpu = env_cpu(env);
  local_30 = env->pc;
  if (is_hw == 0) {
    if (cpu->exception_index == 0x100) {
      cf_rte(env);
      return;
    }
    if (cpu->exception_index == 0x101) {
      cpu->halted = 1;
      cpu->exception_index = 0x10001;
      cpu_loop_exit_m68k(cpu);
    }
    if ((0x1f < cpu->exception_index) && (cpu->exception_index < 0x30)) {
      local_30 = local_30 + 2;
    }
  }
  iVar1 = cpu->exception_index;
  uVar2 = env->sr;
  uVar4 = cpu_m68k_get_ccr_m68k(env);
  env->sr = env->sr | 0x2000;
  if (is_hw != 0) {
    env->sr = env->sr & 0xfffff8ff | env->pending_level << 8;
    env->sr = env->sr & 0xffffefff;
  }
  m68k_switch_sp_m68k(env);
  uVar3 = env->aregs[7];
  uVar5 = uVar3 & 0xfffffffc;
  cpu_stl_mmuidx_ra_m68k(env,uVar5 - 4,local_30,0,0);
  addr = uVar5 - 8;
  cpu_stl_mmuidx_ra_m68k
            (env,addr,(uVar3 & 3) << 0x1c | uVar2 | uVar4 | iVar1 << 0x12 | 0x40000000U,0,0);
  env->aregs[7] = addr;
  uVar4 = cpu_ldl_mmuidx_ra_m68k(env,env->vbr + iVar1 * 4,0,0);
  env->pc = uVar4;
  return;
}

Assistant:

static void cf_interrupt_all(CPUM68KState *env, int is_hw)
{
    CPUState *cs = env_cpu(env);
    uint32_t sp;
    uint32_t sr;
    uint32_t fmt;
    uint32_t retaddr;
    uint32_t vector;

    fmt = 0;
    retaddr = env->pc;

    if (!is_hw) {
        switch (cs->exception_index) {
        case EXCP_RTE:
            /* Return from an exception.  */
            cf_rte(env);
            return;
        case EXCP_HALT_INSN:
            cs->halted = 1;
            cs->exception_index = EXCP_HLT;
            cpu_loop_exit(cs);
            return;
        }
        if (cs->exception_index >= EXCP_TRAP0
            && cs->exception_index <= EXCP_TRAP15) {
            /* Move the PC after the trap instruction.  */
            retaddr += 2;
        }
    }

    vector = cs->exception_index << 2;

    sr = env->sr | cpu_m68k_get_ccr(env);

    fmt |= 0x40000000;
    fmt |= vector << 16;
    fmt |= sr;

    env->sr |= SR_S;
    if (is_hw) {
        env->sr = (env->sr & ~SR_I) | (env->pending_level << SR_I_SHIFT);
        env->sr &= ~SR_M;
    }
    m68k_switch_sp(env);
    sp = env->aregs[7];
    fmt |= (sp & 3) << 28;

    /* ??? This could cause MMU faults.  */
    sp &= ~3;
    sp -= 4;
    cpu_stl_mmuidx_ra(env, sp, retaddr, MMU_KERNEL_IDX, 0);
    sp -= 4;
    cpu_stl_mmuidx_ra(env, sp, fmt, MMU_KERNEL_IDX, 0);
    env->aregs[7] = sp;
    /* Jump to vector.  */
    env->pc = cpu_ldl_mmuidx_ra(env, env->vbr + vector, MMU_KERNEL_IDX, 0);
}